

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile_test.cpp
# Opt level: O1

int main(void)

{
  uint __val;
  uint __len;
  int iVar1;
  string str;
  string sId;
  WriteFile write;
  char *pcStack_100a0;
  size_t sStack_10098;
  char acStack_10090 [16];
  char *pcStack_10080;
  size_t sStack_10078;
  char acStack_10070 [16];
  string sStack_10060;
  WriteFile WStack_10040;
  
  sStack_10060._M_dataplus._M_p = (pointer)&sStack_10060.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10060,"./temp.log","");
  WriteFile::WriteFile(&WStack_10040,&sStack_10060);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10060._M_dataplus._M_p != &sStack_10060.field_2) {
    operator_delete(sStack_10060._M_dataplus._M_p);
  }
  pcStack_100a0 = acStack_10090;
  sStack_10098 = 0;
  acStack_10090[0] = '\0';
  iVar1 = -0x1a;
  do {
    std::__cxx11::string::push_back((char)&pcStack_100a0);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0);
  __val = 0;
  do {
    __len = 1;
    if ((9 < __val) && (__len = 2, 99 < __val)) {
      __len = 4 - (__val < 1000);
    }
    pcStack_10080 = acStack_10070;
    std::__cxx11::string::_M_construct((ulong)&pcStack_10080,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(pcStack_10080,__len,__val);
    WriteFile::Append(&WStack_10040,pcStack_10080,sStack_10078);
    WriteFile::Append(&WStack_10040," : ",3);
    WriteFile::Append(&WStack_10040,pcStack_100a0,sStack_10098);
    WriteFile::Append(&WStack_10040,"\n",1);
    if (pcStack_10080 != acStack_10070) {
      operator_delete(pcStack_10080);
    }
    __val = __val + 1;
  } while (__val != 10000);
  WriteFile::Sync(&WStack_10040);
  if (pcStack_100a0 != acStack_10090) {
    operator_delete(pcStack_100a0);
  }
  WriteFile::~WriteFile(&WStack_10040);
  return 0;
}

Assistant:

int main()
{
	WriteFile write("./temp.log");
	
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (int i = 0; i < 10000; ++i)
	{
		string sId = to_string(i);
		write.Append(sId.c_str(), sId.size());
		write.Append(" : ", 3);
		write.Append(str.c_str(), str.size());
		write.Append("\n", 1);
	}
	
	write.Sync();
}